

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_interface.h
# Opt level: O2

int katherine_cmd_wait_ack_crd(katherine_udp_t *udp,char *ack)

{
  int iVar1;
  
  iVar1 = katherine_udp_recv_exact(udp,ack,8);
  return iVar1;
}

Assistant:

static inline int
katherine_cmd_wait_ack_crd(katherine_udp_t* udp, char *ack)
{
    int res;

    res = katherine_udp_recv_exact(udp, ack, 8);
    if (res) goto err;

    // TODO: optionally check command response id
    return 0;

err:
    return res;
}